

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

void __thiscall fasttext::Matrix::load(Matrix *this,istream *in)

{
  pointer pfVar1;
  allocator_type local_39;
  undefined1 local_38 [16];
  pointer local_28;
  
  std::istream::read((char *)in,(long)&this->m_);
  std::istream::read((char *)in,(long)&this->n_);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38,this->n_ * this->m_,&local_39);
  (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_28;
  pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_38._0_8_;
  (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_38._8_8_;
  local_38 = ZEXT816(0) << 0x20;
  local_28 = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  if ((pointer)local_38._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_38._0_8_);
  }
  std::istream::read((char *)in,
                     (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Matrix::load(std::istream& in) {
  in.read((char*)&m_, sizeof(int64_t));
  in.read((char*)&n_, sizeof(int64_t));
  data_ = std::vector<real>(m_ * n_);
  in.read((char*)data_.data(), m_ * n_ * sizeof(real));
}